

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genConsoleOut(InstructionGenerator *this,uint argCount)

{
  uint a;
  uint uVar1;
  uint local_58 [2];
  undefined1 local_50 [48];
  
  local_58[1] = 0;
  local_58[0] = argCount;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,(Instruction *)(local_58 + 1));
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,local_58);
  for (uVar1 = 0; uVar1 < local_58[0]; uVar1 = uVar1 + 1) {
    VirtualStack::pop((Variable *)local_50,&this->super_VirtualStack);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  return;
}

Assistant:

void InstructionGenerator::genConsoleOut(unsigned int argCount)
{
    bytecode->emplace_back(Instruction::CONSOLE_OUT);
    bytecode->emplace_back(argCount);
    for(unsigned int a = 0; a < argCount; a++)
        pop();
}